

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfile.c
# Opt level: O0

int hclose(hFILE *fp)

{
  int iVar1;
  int *piVar2;
  int local_1c;
  int err;
  hFILE *fp_local;
  
  local_1c = fp->has_errno;
  iVar1 = writebuffer_is_nonempty(fp);
  if (iVar1 != 0) {
    iVar1 = hflush(fp);
    if (iVar1 < 0) {
      local_1c = fp->has_errno;
    }
  }
  iVar1 = (*fp->backend->close)(fp);
  if (iVar1 < 0) {
    piVar2 = __errno_location();
    local_1c = *piVar2;
  }
  hfile_destroy(fp);
  if (local_1c == 0) {
    fp_local._4_4_ = 0;
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = local_1c;
    fp_local._4_4_ = -1;
  }
  return fp_local._4_4_;
}

Assistant:

int hclose(hFILE *fp)
{
    int err = fp->has_errno;

    if (writebuffer_is_nonempty(fp) && hflush(fp) < 0) err = fp->has_errno;
    if (fp->backend->close(fp) < 0) err = errno;
    hfile_destroy(fp);

    if (err) {
        errno = err;
        return EOF;
    }
    else return 0;
}